

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btBoxBoxDetector.cpp
# Opt level: O3

int intersectRectQuad2(btScalar *h,btScalar *p,btScalar *ret)

{
  bool bVar1;
  uint uVar2;
  btScalar *pbVar3;
  ulong uVar4;
  uint uVar5;
  int iVar6;
  btScalar *pbVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  int iVar12;
  btScalar *pbVar13;
  bool bVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  btScalar buffer [16];
  btScalar local_78 [18];
  
  uVar5 = 4;
  uVar4 = 0;
  pbVar7 = ret;
  bVar14 = true;
  do {
    bVar1 = bVar14;
    uVar8 = uVar4 ^ 1;
    pbVar13 = p;
    iVar12 = -1;
    do {
      p = pbVar7;
      uVar2 = 0;
      if (0 < (int)uVar5) {
        fVar15 = (float)iVar12;
        iVar6 = uVar5 + 1;
        lVar10 = 0;
        uVar5 = 0;
        pbVar7 = p;
        lVar9 = uVar4 * 4;
        lVar11 = uVar8 * 4;
        do {
          fVar17 = *(float *)((long)pbVar13 + lVar9);
          fVar18 = fVar17 * fVar15;
          fVar16 = h[uVar4];
          if (fVar18 < fVar16) {
            *pbVar7 = *(btScalar *)((long)pbVar13 + lVar10);
            pbVar7[1] = *(btScalar *)((long)pbVar13 + lVar10 + 4);
            uVar5 = uVar5 + 1;
            if ((uVar5 & 8) != 0) goto LAB_0013ff29;
            pbVar7 = pbVar7 + 2;
            fVar17 = *(float *)((long)pbVar13 + lVar9);
            fVar16 = h[uVar4];
            fVar18 = fVar17 * fVar15;
          }
          pbVar3 = (btScalar *)((long)pbVar13 + lVar10 + 8);
          if (iVar6 == 2) {
            pbVar3 = pbVar13;
          }
          if (fVar18 < fVar16 != pbVar3[uVar4] * fVar15 < fVar16) {
            pbVar7[uVar8] =
                 (fVar16 * fVar15 - fVar17) *
                 ((pbVar3[uVar8] - *(float *)((long)pbVar13 + lVar11)) / (pbVar3[uVar4] - fVar17)) +
                 *(float *)((long)pbVar13 + lVar11);
            pbVar7[uVar4] = h[uVar4] * fVar15;
            uVar5 = uVar5 + 1;
            if ((uVar5 & 8) != 0) goto LAB_0013ff29;
            pbVar7 = pbVar7 + 2;
          }
          iVar6 = iVar6 + -1;
          lVar9 = lVar9 + 8;
          lVar11 = lVar11 + 8;
          lVar10 = lVar10 + 8;
          uVar2 = uVar5;
        } while (1 < iVar6);
      }
      uVar5 = uVar2;
      pbVar7 = ret;
      if (p == ret) {
        pbVar7 = local_78;
      }
      bVar14 = iVar12 < 0;
      pbVar13 = p;
      iVar12 = iVar12 + 2;
    } while (bVar14);
    uVar4 = 1;
    bVar14 = false;
  } while (bVar1);
LAB_0013ff29:
  if (p != ret) {
    memcpy(ret,p,(long)(int)(uVar5 * 2) << 2);
  }
  return uVar5;
}

Assistant:

static int intersectRectQuad2 (btScalar h[2], btScalar p[8], btScalar ret[16])
{
  // q (and r) contain nq (and nr) coordinate points for the current (and
  // chopped) polygons
  int nq=4,nr=0;
  btScalar buffer[16];
  btScalar *q = p;
  btScalar *r = ret;
  for (int dir=0; dir <= 1; dir++) {
    // direction notation: xy[0] = x axis, xy[1] = y axis
    for (int sign=-1; sign <= 1; sign += 2) {
      // chop q along the line xy[dir] = sign*h[dir]
      btScalar *pq = q;
      btScalar *pr = r;
      nr = 0;
      for (int i=nq; i > 0; i--) {
	// go through all points in q and all lines between adjacent points
	if (sign*pq[dir] < h[dir]) {
	  // this point is inside the chopping line
	  pr[0] = pq[0];
	  pr[1] = pq[1];
	  pr += 2;
	  nr++;
	  if (nr & 8) {
	    q = r;
	    goto done;
	  }
	}
	btScalar *nextq = (i > 1) ? pq+2 : q;
	if ((sign*pq[dir] < h[dir]) ^ (sign*nextq[dir] < h[dir])) {
	  // this line crosses the chopping line
	  pr[1-dir] = pq[1-dir] + (nextq[1-dir]-pq[1-dir]) /
	    (nextq[dir]-pq[dir]) * (sign*h[dir]-pq[dir]);
	  pr[dir] = sign*h[dir];
	  pr += 2;
	  nr++;
	  if (nr & 8) {
	    q = r;
	    goto done;
	  }
	}
	pq += 2;
      }
      q = r;
      r = (q==ret) ? buffer : ret;
      nq = nr;
    }
  }
 done:
  if (q != ret) memcpy (ret,q,nr*2*sizeof(btScalar));
  return nr;
}